

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Geometry *pGVar7;
  RTCIntersectArguments *pRVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  undefined1 auVar20 [16];
  AABBNodeMB4D *node1;
  ulong uVar21;
  long lVar22;
  int iVar23;
  undefined4 uVar24;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar25;
  size_t sVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  float fVar41;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar42;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar64;
  float fVar66;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar69;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar65;
  float fVar67;
  float fVar68;
  float fVar70;
  undefined1 auVar63 [16];
  float fVar71;
  float fVar85;
  float fVar86;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar87;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  float fVar89;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar101;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  float fVar121;
  float fVar122;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar130;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar136;
  float fVar138;
  float fVar139;
  undefined1 auVar137 [16];
  float fVar140;
  float fVar141;
  float fVar143;
  float fVar144;
  undefined1 auVar142 [16];
  float fVar145;
  float fVar146;
  float fVar149;
  float fVar150;
  undefined1 auVar147 [16];
  float fVar151;
  undefined1 auVar148 [16];
  float fVar152;
  float fVar155;
  float fVar156;
  undefined1 auVar153 [16];
  float fVar157;
  undefined1 auVar154 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  int local_acc;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  undefined8 local_ab8;
  float fStack_ab0;
  float fStack_aac;
  ulong local_aa8;
  ulong local_aa0;
  ulong local_a98;
  NodeRef *local_a90;
  ulong local_a88;
  ulong local_a80;
  ulong local_a78;
  ulong local_a70;
  undefined1 local_a68 [16];
  Scene *local_a58;
  float fStack_a50;
  float fStack_a4c;
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  auVar20 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      local_a90 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar6 = (ray->dir).field_0;
      auVar33 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar90._8_4_ = 0x7fffffff;
      auVar90._0_8_ = 0x7fffffff7fffffff;
      auVar90._12_4_ = 0x7fffffff;
      auVar90 = vandps_avx((undefined1  [16])aVar6,auVar90);
      auVar103._8_4_ = 0x219392ef;
      auVar103._0_8_ = 0x219392ef219392ef;
      auVar103._12_4_ = 0x219392ef;
      auVar90 = vcmpps_avx(auVar90,auVar103,1);
      auVar104._8_4_ = 0x3f800000;
      auVar104._0_8_ = &DAT_3f8000003f800000;
      auVar104._12_4_ = 0x3f800000;
      auVar103 = vdivps_avx(auVar104,(undefined1  [16])aVar6);
      auVar105._8_4_ = 0x5d5e0b6b;
      auVar105._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar105._12_4_ = 0x5d5e0b6b;
      auVar90 = vblendvps_avx(auVar103,auVar105,auVar90);
      auVar91._0_4_ = auVar90._0_4_ * 0.99999964;
      auVar91._4_4_ = auVar90._4_4_ * 0.99999964;
      auVar91._8_4_ = auVar90._8_4_ * 0.99999964;
      auVar91._12_4_ = auVar90._12_4_ * 0.99999964;
      auVar72._0_4_ = auVar90._0_4_ * 1.0000004;
      auVar72._4_4_ = auVar90._4_4_ * 1.0000004;
      auVar72._8_4_ = auVar90._8_4_ * 1.0000004;
      auVar72._12_4_ = auVar90._12_4_ * 1.0000004;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_a68._4_4_ = uVar4;
      local_a68._0_4_ = uVar4;
      local_a68._8_4_ = uVar4;
      local_a68._12_4_ = uVar4;
      auVar120 = ZEXT1664(local_a68);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar104 = vshufps_avx(auVar91,auVar91,0);
      auVar90 = vmovshdup_avx(auVar91);
      auVar105 = vshufps_avx(auVar91,auVar91,0x55);
      auVar103 = vshufpd_avx(auVar91,auVar91,1);
      auVar17 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar18 = vshufps_avx(auVar72,auVar72,0);
      local_a98 = (ulong)(auVar91._0_4_ < 0.0) << 4;
      auVar91 = vshufps_avx(auVar72,auVar72,0x55);
      auVar72 = vshufps_avx(auVar72,auVar72,0xaa);
      local_aa0 = (ulong)(auVar90._0_4_ < 0.0) << 4 | 0x20;
      local_aa8 = (ulong)(auVar103._0_4_ < 0.0) << 4 | 0x40;
      uVar29 = local_a98 ^ 0x10;
      uVar30 = local_aa0 ^ 0x10;
      uVar28 = local_aa8 ^ 0x10;
      auVar90 = vshufps_avx(auVar33,auVar33,0);
      auVar103 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      local_a88 = uVar28;
      local_a80 = uVar30;
      local_a78 = uVar29;
      do {
        if (local_a90 == stack) {
          return;
        }
        sVar26 = local_a90[-1].ptr;
        local_a90 = local_a90 + -1;
        do {
          if ((sVar26 & 8) == 0) {
            uVar21 = sVar26 & 0xfffffffffffffff0;
            fVar3 = (ray->dir).field_0.m128[3];
            auVar32._4_4_ = fVar3;
            auVar32._0_4_ = fVar3;
            auVar32._8_4_ = fVar3;
            auVar32._12_4_ = fVar3;
            pfVar2 = (float *)(uVar21 + 0x80 + local_a98);
            pfVar1 = (float *)(uVar21 + 0x20 + local_a98);
            auVar33._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar33._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar33._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar33._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar33 = vsubps_avx(auVar33,auVar120._0_16_);
            local_8b8 = auVar104._0_4_;
            fStack_8b4 = auVar104._4_4_;
            fStack_8b0 = auVar104._8_4_;
            fStack_8ac = auVar104._12_4_;
            auVar43._0_4_ = auVar33._0_4_ * local_8b8;
            auVar43._4_4_ = auVar33._4_4_ * fStack_8b4;
            auVar43._8_4_ = auVar33._8_4_ * fStack_8b0;
            auVar43._12_4_ = auVar33._12_4_ * fStack_8ac;
            auVar33 = vmaxps_avx(auVar90,auVar43);
            pfVar2 = (float *)(uVar21 + 0x80 + local_aa0);
            pfVar1 = (float *)(uVar21 + 0x20 + local_aa0);
            auVar54._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar54._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar54._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar54._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar113._4_4_ = uVar4;
            auVar113._0_4_ = uVar4;
            auVar113._8_4_ = uVar4;
            auVar113._12_4_ = uVar4;
            auVar43 = vsubps_avx(auVar54,auVar113);
            local_8c8 = auVar105._0_4_;
            fStack_8c4 = auVar105._4_4_;
            fStack_8c0 = auVar105._8_4_;
            fStack_8bc = auVar105._12_4_;
            auVar55._0_4_ = auVar43._0_4_ * local_8c8;
            auVar55._4_4_ = auVar43._4_4_ * fStack_8c4;
            auVar55._8_4_ = auVar43._8_4_ * fStack_8c0;
            auVar55._12_4_ = auVar43._12_4_ * fStack_8bc;
            pfVar2 = (float *)(uVar21 + 0x80 + local_aa8);
            pfVar1 = (float *)(uVar21 + 0x20 + local_aa8);
            auVar73._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar73._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar73._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar73._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar114._4_4_ = uVar5;
            auVar114._0_4_ = uVar5;
            auVar114._8_4_ = uVar5;
            auVar114._12_4_ = uVar5;
            auVar43 = vsubps_avx(auVar73,auVar114);
            local_8d8 = auVar17._0_4_;
            fStack_8d4 = auVar17._4_4_;
            fStack_8d0 = auVar17._8_4_;
            fStack_8cc = auVar17._12_4_;
            auVar74._0_4_ = auVar43._0_4_ * local_8d8;
            auVar74._4_4_ = auVar43._4_4_ * fStack_8d4;
            auVar74._8_4_ = auVar43._8_4_ * fStack_8d0;
            auVar74._12_4_ = auVar43._12_4_ * fStack_8cc;
            auVar43 = vmaxps_avx(auVar55,auVar74);
            auVar33 = vmaxps_avx(auVar33,auVar43);
            pfVar2 = (float *)(uVar21 + 0x80 + uVar29);
            pfVar1 = (float *)(uVar21 + 0x20 + uVar29);
            auVar56._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar56._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar56._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar56._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar43 = vsubps_avx(auVar56,auVar120._0_16_);
            local_8e8 = auVar18._0_4_;
            fStack_8e4 = auVar18._4_4_;
            fStack_8e0 = auVar18._8_4_;
            fStack_8dc = auVar18._12_4_;
            auVar57._0_4_ = auVar43._0_4_ * local_8e8;
            auVar57._4_4_ = auVar43._4_4_ * fStack_8e4;
            auVar57._8_4_ = auVar43._8_4_ * fStack_8e0;
            auVar57._12_4_ = auVar43._12_4_ * fStack_8dc;
            pfVar2 = (float *)(uVar21 + 0x80 + uVar30);
            auVar43 = vminps_avx(auVar103,auVar57);
            pfVar1 = (float *)(uVar21 + 0x20 + uVar30);
            auVar75._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar75._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar75._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar75._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar113 = vsubps_avx(auVar75,auVar113);
            pfVar2 = (float *)(uVar21 + 0x80 + uVar28);
            pfVar1 = (float *)(uVar21 + 0x20 + uVar28);
            auVar92._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar92._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar92._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar92._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            local_8f8 = auVar91._0_4_;
            fStack_8f4 = auVar91._4_4_;
            fStack_8f0 = auVar91._8_4_;
            fStack_8ec = auVar91._12_4_;
            auVar76._0_4_ = auVar113._0_4_ * local_8f8;
            auVar76._4_4_ = auVar113._4_4_ * fStack_8f4;
            auVar76._8_4_ = auVar113._8_4_ * fStack_8f0;
            auVar76._12_4_ = auVar113._12_4_ * fStack_8ec;
            auVar113 = vsubps_avx(auVar92,auVar114);
            local_908 = auVar72._0_4_;
            fStack_904 = auVar72._4_4_;
            fStack_900 = auVar72._8_4_;
            fStack_8fc = auVar72._12_4_;
            auVar93._0_4_ = auVar113._0_4_ * local_908;
            auVar93._4_4_ = auVar113._4_4_ * fStack_904;
            auVar93._8_4_ = auVar113._8_4_ * fStack_900;
            auVar93._12_4_ = auVar113._12_4_ * fStack_8fc;
            auVar113 = vminps_avx(auVar76,auVar93);
            auVar43 = vminps_avx(auVar43,auVar113);
            if (((uint)sVar26 & 7) == 6) {
              auVar43 = vcmpps_avx(auVar33,auVar43,2);
              auVar33 = vcmpps_avx(*(undefined1 (*) [16])(uVar21 + 0xe0),auVar32,2);
              auVar113 = vcmpps_avx(auVar32,*(undefined1 (*) [16])(uVar21 + 0xf0),1);
              auVar33 = vandps_avx(auVar33,auVar113);
              auVar33 = vandps_avx(auVar33,auVar43);
            }
            else {
              auVar33 = vcmpps_avx(auVar33,auVar43,2);
            }
            auVar33 = vpslld_avx(auVar33,0x1f);
            uVar24 = vmovmskps_avx(auVar33);
            unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar24);
          }
          if ((sVar26 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar23 = 4;
            }
            else {
              uVar21 = sVar26 & 0xfffffffffffffff0;
              lVar22 = 0;
              if (unaff_RBX != 0) {
                for (; (unaff_RBX >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              iVar23 = 0;
              sVar26 = *(size_t *)(uVar21 + lVar22 * 8);
              uVar25 = unaff_RBX - 1 & unaff_RBX;
              if (uVar25 != 0) {
                local_a90->ptr = sVar26;
                lVar22 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                  }
                }
                uVar27 = uVar25 - 1;
                while( true ) {
                  local_a90 = local_a90 + 1;
                  sVar26 = *(size_t *)(uVar21 + lVar22 * 8);
                  uVar27 = uVar27 & uVar25;
                  if (uVar27 == 0) break;
                  local_a90->ptr = sVar26;
                  lVar22 = 0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                    }
                  }
                  uVar25 = uVar27 - 1;
                }
                iVar23 = 0;
              }
            }
          }
          else {
            iVar23 = 6;
          }
        } while (iVar23 == 0);
        if (iVar23 == 6) {
          iVar23 = 0;
          uVar21 = (ulong)((uint)sVar26 & 0xf) - 8;
          bVar31 = uVar21 != 0;
          if (bVar31) {
            uVar27 = sVar26 & 0xfffffffffffffff0;
            uVar25 = 0;
            do {
              lVar22 = uVar25 * 0x140;
              fVar3 = (ray->dir).field_0.m128[3];
              pfVar2 = (float *)(uVar27 + 0x90 + lVar22);
              pfVar1 = (float *)(uVar27 + lVar22);
              auVar44._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar44._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar44._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar44._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar27 + 0xa0 + lVar22);
              pfVar1 = (float *)(uVar27 + 0x10 + lVar22);
              auVar58._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar58._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar58._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar58._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar27 + 0xb0 + lVar22);
              pfVar1 = (float *)(uVar27 + 0x20 + lVar22);
              auVar137._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar137._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar137._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar137._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar27 + 0xc0 + lVar22);
              pfVar1 = (float *)(uVar27 + 0x30 + lVar22);
              auVar94._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar94._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar94._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar94._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar27 + 0xd0 + lVar22);
              pfVar1 = (float *)(uVar27 + 0x40 + lVar22);
              auVar106._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar106._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar106._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar106._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar27 + 0xe0 + lVar22);
              pfVar1 = (float *)(uVar27 + 0x50 + lVar22);
              auVar142._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar142._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar142._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar142._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar27 + 0xf0 + lVar22);
              pfVar1 = (float *)(uVar27 + 0x60 + lVar22);
              auVar123._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar123._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar123._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar123._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar27 + 0x100 + lVar22);
              pfVar1 = (float *)(uVar27 + 0x70 + lVar22);
              auVar131._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar131._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar131._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar131._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              pfVar1 = (float *)(uVar27 + 0x110 + lVar22);
              pfVar2 = (float *)(uVar27 + 0x80 + lVar22);
              auVar34._0_4_ = fVar3 * *pfVar1 + *pfVar2;
              auVar34._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
              auVar34._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
              auVar34._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
              uVar24 = *(undefined4 *)&(ray->org).field_0;
              auVar135._4_4_ = uVar24;
              auVar135._0_4_ = uVar24;
              auVar135._8_4_ = uVar24;
              auVar135._12_4_ = uVar24;
              uVar24 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar147._4_4_ = uVar24;
              auVar147._0_4_ = uVar24;
              auVar147._8_4_ = uVar24;
              auVar147._12_4_ = uVar24;
              uVar24 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar153._4_4_ = uVar24;
              auVar153._0_4_ = uVar24;
              auVar153._8_4_ = uVar24;
              auVar153._12_4_ = uVar24;
              local_a38 = vsubps_avx(auVar44,auVar135);
              local_a48 = vsubps_avx(auVar58,auVar147);
              auVar33 = vsubps_avx(auVar137,auVar153);
              auVar43 = vsubps_avx(auVar94,auVar135);
              auVar113 = vsubps_avx(auVar106,auVar147);
              auVar114 = vsubps_avx(auVar142,auVar153);
              auVar32 = vsubps_avx(auVar123,auVar135);
              auVar54 = vsubps_avx(auVar131,auVar147);
              auVar55 = vsubps_avx(auVar34,auVar153);
              auVar56 = vsubps_avx(auVar32,local_a38);
              auVar57 = vsubps_avx(auVar54,local_a48);
              auVar73 = vsubps_avx(auVar55,auVar33);
              fVar3 = local_a48._0_4_;
              fVar52 = auVar54._0_4_ + fVar3;
              fVar11 = local_a48._4_4_;
              fVar64 = auVar54._4_4_ + fVar11;
              fVar70 = local_a48._8_4_;
              fVar66 = auVar54._8_4_ + fVar70;
              fVar14 = local_a48._12_4_;
              fVar69 = auVar54._12_4_ + fVar14;
              fVar9 = auVar33._0_4_;
              fVar88 = auVar55._0_4_ + fVar9;
              fVar65 = auVar33._4_4_;
              fVar97 = auVar55._4_4_ + fVar65;
              fVar12 = auVar33._8_4_;
              fVar99 = auVar55._8_4_ + fVar12;
              fVar15 = auVar33._12_4_;
              fVar101 = auVar55._12_4_ + fVar15;
              fVar53 = auVar73._0_4_;
              auVar124._0_4_ = fVar53 * fVar52;
              fVar67 = auVar73._4_4_;
              auVar124._4_4_ = fVar67 * fVar64;
              fVar41 = auVar73._8_4_;
              auVar124._8_4_ = fVar41 * fVar66;
              fVar42 = auVar73._12_4_;
              auVar124._12_4_ = fVar42 * fVar69;
              fVar158 = auVar57._0_4_;
              auVar132._0_4_ = fVar158 * fVar88;
              fVar159 = auVar57._4_4_;
              auVar132._4_4_ = fVar159 * fVar97;
              fVar160 = auVar57._8_4_;
              auVar132._8_4_ = fVar160 * fVar99;
              fVar161 = auVar57._12_4_;
              auVar132._12_4_ = fVar161 * fVar101;
              auVar57 = vsubps_avx(auVar132,auVar124);
              fVar10 = local_a38._0_4_;
              fVar121 = auVar32._0_4_ + fVar10;
              fVar68 = local_a38._4_4_;
              fVar128 = auVar32._4_4_ + fVar68;
              fVar13 = local_a38._8_4_;
              fVar129 = auVar32._8_4_ + fVar13;
              fVar16 = local_a38._12_4_;
              fVar130 = auVar32._12_4_ + fVar16;
              fVar152 = auVar56._0_4_;
              auVar95._0_4_ = fVar152 * fVar88;
              fVar155 = auVar56._4_4_;
              auVar95._4_4_ = fVar155 * fVar97;
              fVar156 = auVar56._8_4_;
              auVar95._8_4_ = fVar156 * fVar99;
              fVar157 = auVar56._12_4_;
              auVar95._12_4_ = fVar157 * fVar101;
              auVar133._0_4_ = fVar121 * fVar53;
              auVar133._4_4_ = fVar128 * fVar67;
              auVar133._8_4_ = fVar129 * fVar41;
              auVar133._12_4_ = fVar130 * fVar42;
              auVar56 = vsubps_avx(auVar133,auVar95);
              auVar125._0_4_ = fVar158 * fVar121;
              auVar125._4_4_ = fVar159 * fVar128;
              auVar125._8_4_ = fVar160 * fVar129;
              auVar125._12_4_ = fVar161 * fVar130;
              auVar35._0_4_ = fVar152 * fVar52;
              auVar35._4_4_ = fVar155 * fVar64;
              auVar35._8_4_ = fVar156 * fVar66;
              auVar35._12_4_ = fVar157 * fVar69;
              auVar73 = vsubps_avx(auVar35,auVar125);
              fStack_ac4 = (ray->dir).field_0.m128[2];
              local_ab8._4_4_ = (ray->dir).field_0.m128[1];
              fStack_a50 = (ray->dir).field_0.m128[0];
              auVar134._0_4_ =
                   auVar57._0_4_ * fStack_a50 +
                   local_ab8._4_4_ * auVar56._0_4_ + fStack_ac4 * auVar73._0_4_;
              auVar134._4_4_ =
                   auVar57._4_4_ * fStack_a50 +
                   local_ab8._4_4_ * auVar56._4_4_ + fStack_ac4 * auVar73._4_4_;
              auVar134._8_4_ =
                   auVar57._8_4_ * fStack_a50 +
                   local_ab8._4_4_ * auVar56._8_4_ + fStack_ac4 * auVar73._8_4_;
              auVar134._12_4_ =
                   auVar57._12_4_ * fStack_a50 +
                   local_ab8._4_4_ * auVar56._12_4_ + fStack_ac4 * auVar73._12_4_;
              auVar56 = vsubps_avx(local_a48,auVar113);
              auVar33 = vsubps_avx(auVar33,auVar114);
              fVar52 = fVar3 + auVar113._0_4_;
              fVar64 = fVar11 + auVar113._4_4_;
              fVar66 = fVar70 + auVar113._8_4_;
              fVar69 = fVar14 + auVar113._12_4_;
              fVar97 = auVar114._0_4_ + fVar9;
              fVar101 = auVar114._4_4_ + fVar65;
              fVar128 = auVar114._8_4_ + fVar12;
              fVar130 = auVar114._12_4_ + fVar15;
              fVar136 = auVar33._0_4_;
              auVar154._0_4_ = fVar136 * fVar52;
              fVar138 = auVar33._4_4_;
              auVar154._4_4_ = fVar138 * fVar64;
              fVar139 = auVar33._8_4_;
              auVar154._8_4_ = fVar139 * fVar66;
              fVar140 = auVar33._12_4_;
              auVar154._12_4_ = fVar140 * fVar69;
              fVar88 = auVar56._0_4_;
              auVar77._0_4_ = fVar88 * fVar97;
              fVar99 = auVar56._4_4_;
              auVar77._4_4_ = fVar99 * fVar101;
              fVar121 = auVar56._8_4_;
              auVar77._8_4_ = fVar121 * fVar128;
              fVar129 = auVar56._12_4_;
              auVar77._12_4_ = fVar129 * fVar130;
              auVar33 = vsubps_avx(auVar77,auVar154);
              auVar56 = vsubps_avx(local_a38,auVar43);
              fVar146 = auVar56._0_4_;
              auVar96._0_4_ = fVar146 * fVar97;
              fVar149 = auVar56._4_4_;
              auVar96._4_4_ = fVar149 * fVar101;
              fVar150 = auVar56._8_4_;
              auVar96._8_4_ = fVar150 * fVar128;
              fVar151 = auVar56._12_4_;
              auVar96._12_4_ = fVar151 * fVar130;
              fVar97 = auVar43._0_4_ + fVar10;
              fVar101 = auVar43._4_4_ + fVar68;
              fVar128 = auVar43._8_4_ + fVar13;
              fVar130 = auVar43._12_4_ + fVar16;
              auVar126._0_4_ = fVar136 * fVar97;
              auVar126._4_4_ = fVar138 * fVar101;
              auVar126._8_4_ = fVar139 * fVar128;
              auVar126._12_4_ = fVar140 * fVar130;
              auVar56 = vsubps_avx(auVar126,auVar96);
              auVar115._0_4_ = fVar88 * fVar97;
              auVar115._4_4_ = fVar99 * fVar101;
              auVar115._8_4_ = fVar121 * fVar128;
              auVar115._12_4_ = fVar129 * fVar130;
              auVar36._0_4_ = fVar146 * fVar52;
              auVar36._4_4_ = fVar149 * fVar64;
              auVar36._8_4_ = fVar150 * fVar66;
              auVar36._12_4_ = fVar151 * fVar69;
              auVar57 = vsubps_avx(auVar36,auVar115);
              auVar37._0_4_ =
                   fStack_a50 * auVar33._0_4_ +
                   local_ab8._4_4_ * auVar56._0_4_ + fStack_ac4 * auVar57._0_4_;
              auVar37._4_4_ =
                   fStack_a50 * auVar33._4_4_ +
                   local_ab8._4_4_ * auVar56._4_4_ + fStack_ac4 * auVar57._4_4_;
              auVar37._8_4_ =
                   fStack_a50 * auVar33._8_4_ +
                   local_ab8._4_4_ * auVar56._8_4_ + fStack_ac4 * auVar57._8_4_;
              auVar37._12_4_ =
                   fStack_a50 * auVar33._12_4_ +
                   local_ab8._4_4_ * auVar56._12_4_ + fStack_ac4 * auVar57._12_4_;
              auVar33 = vsubps_avx(auVar43,auVar32);
              fVar71 = auVar43._0_4_ + auVar32._0_4_;
              fVar85 = auVar43._4_4_ + auVar32._4_4_;
              fVar86 = auVar43._8_4_ + auVar32._8_4_;
              fVar87 = auVar43._12_4_ + auVar32._12_4_;
              auVar43 = vsubps_avx(auVar113,auVar54);
              fVar97 = auVar113._0_4_ + auVar54._0_4_;
              fVar101 = auVar113._4_4_ + auVar54._4_4_;
              fVar128 = auVar113._8_4_ + auVar54._8_4_;
              fVar130 = auVar113._12_4_ + auVar54._12_4_;
              auVar113 = vsubps_avx(auVar114,auVar55);
              fVar52 = auVar114._0_4_ + auVar55._0_4_;
              fVar64 = auVar114._4_4_ + auVar55._4_4_;
              fVar66 = auVar114._8_4_ + auVar55._8_4_;
              fVar69 = auVar114._12_4_ + auVar55._12_4_;
              fVar89 = auVar113._0_4_;
              auVar107._0_4_ = fVar89 * fVar97;
              fVar98 = auVar113._4_4_;
              auVar107._4_4_ = fVar98 * fVar101;
              fVar100 = auVar113._8_4_;
              auVar107._8_4_ = fVar100 * fVar128;
              fVar102 = auVar113._12_4_;
              auVar107._12_4_ = fVar102 * fVar130;
              fVar141 = auVar43._0_4_;
              auVar116._0_4_ = fVar141 * fVar52;
              fVar143 = auVar43._4_4_;
              auVar116._4_4_ = fVar143 * fVar64;
              fVar144 = auVar43._8_4_;
              auVar116._8_4_ = fVar144 * fVar66;
              fVar145 = auVar43._12_4_;
              auVar116._12_4_ = fVar145 * fVar69;
              auVar43 = vsubps_avx(auVar116,auVar107);
              fVar122 = auVar33._0_4_;
              auVar45._0_4_ = fVar122 * fVar52;
              fVar52 = auVar33._4_4_;
              auVar45._4_4_ = fVar52 * fVar64;
              fVar64 = auVar33._8_4_;
              auVar45._8_4_ = fVar64 * fVar66;
              fVar66 = auVar33._12_4_;
              auVar45._12_4_ = fVar66 * fVar69;
              auVar117._0_4_ = fVar89 * fVar71;
              auVar117._4_4_ = fVar98 * fVar85;
              auVar117._8_4_ = fVar100 * fVar86;
              auVar117._12_4_ = fVar102 * fVar87;
              auVar33 = vsubps_avx(auVar117,auVar45);
              auVar120 = ZEXT1664(local_a68);
              auVar78._0_4_ = fVar141 * fVar71;
              auVar78._4_4_ = fVar143 * fVar85;
              auVar78._8_4_ = fVar144 * fVar86;
              auVar78._12_4_ = fVar145 * fVar87;
              auVar59._0_4_ = fVar122 * fVar97;
              auVar59._4_4_ = fVar52 * fVar101;
              auVar59._8_4_ = fVar64 * fVar128;
              auVar59._12_4_ = fVar66 * fVar130;
              auVar113 = vsubps_avx(auVar59,auVar78);
              local_ac8 = fStack_ac4;
              fStack_ac0 = fStack_ac4;
              fStack_abc = fStack_ac4;
              local_ab8._0_4_ = local_ab8._4_4_;
              fStack_ab0 = local_ab8._4_4_;
              fStack_aac = local_ab8._4_4_;
              auVar46._0_4_ =
                   fStack_a50 * auVar43._0_4_ +
                   local_ab8._4_4_ * auVar33._0_4_ + fStack_ac4 * auVar113._0_4_;
              auVar46._4_4_ =
                   fStack_a50 * auVar43._4_4_ +
                   local_ab8._4_4_ * auVar33._4_4_ + fStack_ac4 * auVar113._4_4_;
              auVar46._8_4_ =
                   fStack_a50 * auVar43._8_4_ +
                   local_ab8._4_4_ * auVar33._8_4_ + fStack_ac4 * auVar113._8_4_;
              auVar46._12_4_ =
                   fStack_a50 * auVar43._12_4_ +
                   local_ab8._4_4_ * auVar33._12_4_ + fStack_ac4 * auVar113._12_4_;
              auVar148._0_4_ = auVar46._0_4_ + auVar134._0_4_ + auVar37._0_4_;
              auVar148._4_4_ = auVar46._4_4_ + auVar134._4_4_ + auVar37._4_4_;
              auVar148._8_4_ = auVar46._8_4_ + auVar134._8_4_ + auVar37._8_4_;
              auVar148._12_4_ = auVar46._12_4_ + auVar134._12_4_ + auVar37._12_4_;
              auVar33 = vminps_avx(auVar134,auVar37);
              auVar43 = vminps_avx(auVar33,auVar46);
              auVar79._8_4_ = 0x7fffffff;
              auVar79._0_8_ = 0x7fffffff7fffffff;
              auVar79._12_4_ = 0x7fffffff;
              auVar33 = vandps_avx(auVar148,auVar79);
              auVar80._0_4_ = auVar33._0_4_ * 1.1920929e-07;
              auVar80._4_4_ = auVar33._4_4_ * 1.1920929e-07;
              auVar80._8_4_ = auVar33._8_4_ * 1.1920929e-07;
              auVar80._12_4_ = auVar33._12_4_ * 1.1920929e-07;
              uVar28 = CONCAT44(auVar80._4_4_,auVar80._0_4_);
              auVar108._0_8_ = uVar28 ^ 0x8000000080000000;
              auVar108._8_4_ = -auVar80._8_4_;
              auVar108._12_4_ = -auVar80._12_4_;
              auVar43 = vcmpps_avx(auVar43,auVar108,5);
              auVar113 = vmaxps_avx(auVar134,auVar37);
              auVar113 = vmaxps_avx(auVar113,auVar46);
              auVar113 = vcmpps_avx(auVar113,auVar80,2);
              auVar43 = vorps_avx(auVar43,auVar113);
              auVar113 = auVar20 & auVar43;
              if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar113[0xf] < '\0') {
                auVar47._0_4_ = fVar88 * fVar53;
                auVar47._4_4_ = fVar99 * fVar67;
                auVar47._8_4_ = fVar121 * fVar41;
                auVar47._12_4_ = fVar129 * fVar42;
                auVar60._0_4_ = fVar158 * fVar136;
                auVar60._4_4_ = fVar159 * fVar138;
                auVar60._8_4_ = fVar160 * fVar139;
                auVar60._12_4_ = fVar161 * fVar140;
                auVar32 = vsubps_avx(auVar60,auVar47);
                auVar81._0_4_ = fVar136 * fVar141;
                auVar81._4_4_ = fVar138 * fVar143;
                auVar81._8_4_ = fVar139 * fVar144;
                auVar81._12_4_ = fVar140 * fVar145;
                auVar109._0_4_ = fVar88 * fVar89;
                auVar109._4_4_ = fVar99 * fVar98;
                auVar109._8_4_ = fVar121 * fVar100;
                auVar109._12_4_ = fVar129 * fVar102;
                auVar54 = vsubps_avx(auVar109,auVar81);
                auVar113 = vandps_avx(auVar79,auVar47);
                auVar114 = vandps_avx(auVar79,auVar81);
                auVar113 = vcmpps_avx(auVar113,auVar114,1);
                local_808 = vblendvps_avx(auVar54,auVar32,auVar113);
                auVar48._0_4_ = fVar146 * fVar89;
                auVar48._4_4_ = fVar149 * fVar98;
                auVar48._8_4_ = fVar150 * fVar100;
                auVar48._12_4_ = fVar151 * fVar102;
                auVar61._0_4_ = fVar146 * fVar53;
                auVar61._4_4_ = fVar149 * fVar67;
                auVar61._8_4_ = fVar150 * fVar41;
                auVar61._12_4_ = fVar151 * fVar42;
                auVar82._0_4_ = fVar136 * fVar152;
                auVar82._4_4_ = fVar138 * fVar155;
                auVar82._8_4_ = fVar139 * fVar156;
                auVar82._12_4_ = fVar140 * fVar157;
                auVar32 = vsubps_avx(auVar61,auVar82);
                auVar110._0_4_ = fVar136 * fVar122;
                auVar110._4_4_ = fVar138 * fVar52;
                auVar110._8_4_ = fVar139 * fVar64;
                auVar110._12_4_ = fVar140 * fVar66;
                auVar54 = vsubps_avx(auVar110,auVar48);
                auVar113 = vandps_avx(auVar79,auVar82);
                auVar114 = vandps_avx(auVar79,auVar48);
                auVar113 = vcmpps_avx(auVar113,auVar114,1);
                local_7f8 = vblendvps_avx(auVar54,auVar32,auVar113);
                auVar38._0_4_ = fVar88 * fVar122;
                auVar38._4_4_ = fVar99 * fVar52;
                auVar38._8_4_ = fVar121 * fVar64;
                auVar38._12_4_ = fVar129 * fVar66;
                auVar62._0_4_ = fVar88 * fVar152;
                auVar62._4_4_ = fVar99 * fVar155;
                auVar62._8_4_ = fVar121 * fVar156;
                auVar62._12_4_ = fVar129 * fVar157;
                auVar83._0_4_ = fVar158 * fVar146;
                auVar83._4_4_ = fVar159 * fVar149;
                auVar83._8_4_ = fVar160 * fVar150;
                auVar83._12_4_ = fVar161 * fVar151;
                auVar111._0_4_ = fVar146 * fVar141;
                auVar111._4_4_ = fVar149 * fVar143;
                auVar111._8_4_ = fVar150 * fVar144;
                auVar111._12_4_ = fVar151 * fVar145;
                auVar32 = vsubps_avx(auVar62,auVar83);
                auVar54 = vsubps_avx(auVar111,auVar38);
                auVar113 = vandps_avx(auVar79,auVar83);
                auVar114 = vandps_avx(auVar79,auVar38);
                auVar113 = vcmpps_avx(auVar113,auVar114,1);
                local_7e8 = vblendvps_avx(auVar54,auVar32,auVar113);
                fVar53 = local_808._0_4_ * fStack_a50 +
                         local_7f8._0_4_ * local_ab8._4_4_ + local_7e8._0_4_ * fStack_ac4;
                fVar52 = local_808._4_4_ * fStack_a50 +
                         local_7f8._4_4_ * local_ab8._4_4_ + local_7e8._4_4_ * fStack_ac4;
                fVar67 = local_808._8_4_ * fStack_a50 +
                         local_7f8._8_4_ * local_ab8._4_4_ + local_7e8._8_4_ * fStack_ac4;
                fVar64 = local_808._12_4_ * fStack_a50 +
                         local_7f8._12_4_ * local_ab8._4_4_ + local_7e8._12_4_ * fStack_ac4;
                auVar84._0_4_ = fVar53 + fVar53;
                auVar84._4_4_ = fVar52 + fVar52;
                auVar84._8_4_ = fVar67 + fVar67;
                auVar84._12_4_ = fVar64 + fVar64;
                fVar53 = local_808._0_4_ * fVar10 +
                         local_7f8._0_4_ * fVar3 + local_7e8._0_4_ * fVar9;
                fVar65 = local_808._4_4_ * fVar68 +
                         local_7f8._4_4_ * fVar11 + local_7e8._4_4_ * fVar65;
                fVar68 = local_808._8_4_ * fVar13 +
                         local_7f8._8_4_ * fVar70 + local_7e8._8_4_ * fVar12;
                fVar70 = local_808._12_4_ * fVar16 +
                         local_7f8._12_4_ * fVar14 + local_7e8._12_4_ * fVar15;
                auVar113 = vrcpps_avx(auVar84);
                fVar3 = auVar113._0_4_;
                auVar118._0_4_ = auVar84._0_4_ * fVar3;
                fVar9 = auVar113._4_4_;
                auVar118._4_4_ = auVar84._4_4_ * fVar9;
                fVar10 = auVar113._8_4_;
                auVar118._8_4_ = auVar84._8_4_ * fVar10;
                fVar11 = auVar113._12_4_;
                auVar118._12_4_ = auVar84._12_4_ * fVar11;
                auVar127._8_4_ = 0x3f800000;
                auVar127._0_8_ = &DAT_3f8000003f800000;
                auVar127._12_4_ = 0x3f800000;
                auVar113 = vsubps_avx(auVar127,auVar118);
                local_818._0_4_ = (fVar53 + fVar53) * (fVar3 + fVar3 * auVar113._0_4_);
                local_818._4_4_ = (fVar65 + fVar65) * (fVar9 + fVar9 * auVar113._4_4_);
                local_818._8_4_ = (fVar68 + fVar68) * (fVar10 + fVar10 * auVar113._8_4_);
                local_818._12_4_ = (fVar70 + fVar70) * (fVar11 + fVar11 * auVar113._12_4_);
                uVar24 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar112._4_4_ = uVar24;
                auVar112._0_4_ = uVar24;
                auVar112._8_4_ = uVar24;
                auVar112._12_4_ = uVar24;
                auVar113 = vcmpps_avx(auVar112,local_818,2);
                fVar3 = ray->tfar;
                auVar119._4_4_ = fVar3;
                auVar119._0_4_ = fVar3;
                auVar119._8_4_ = fVar3;
                auVar119._12_4_ = fVar3;
                auVar114 = vcmpps_avx(local_818,auVar119,2);
                auVar113 = vandps_avx(auVar113,auVar114);
                auVar120 = ZEXT1664(local_a68);
                auVar114 = vcmpps_avx(auVar84,_DAT_01feba10,4);
                auVar113 = vandps_avx(auVar114,auVar113);
                auVar43 = vandps_avx(auVar43,auVar20);
                auVar113 = vpslld_avx(auVar113,0x1f);
                auVar114 = vpsrad_avx(auVar113,0x1f);
                auVar113 = auVar43 & auVar114;
                if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar113[0xf] < '\0') {
                  auVar43 = vandps_avx(auVar114,auVar43);
                  local_a58 = context->scene;
                  auVar113 = vrcpps_avx(auVar148);
                  fVar3 = auVar113._0_4_;
                  auVar49._0_4_ = auVar148._0_4_ * fVar3;
                  fVar9 = auVar113._4_4_;
                  auVar49._4_4_ = auVar148._4_4_ * fVar9;
                  fVar10 = auVar113._8_4_;
                  auVar49._8_4_ = auVar148._8_4_ * fVar10;
                  fVar11 = auVar113._12_4_;
                  auVar49._12_4_ = auVar148._12_4_ * fVar11;
                  auVar63._8_4_ = 0x3f800000;
                  auVar63._0_8_ = &DAT_3f8000003f800000;
                  auVar63._12_4_ = 0x3f800000;
                  auVar113 = vsubps_avx(auVar63,auVar49);
                  auVar39._0_4_ = fVar3 + fVar3 * auVar113._0_4_;
                  auVar39._4_4_ = fVar9 + fVar9 * auVar113._4_4_;
                  auVar39._8_4_ = fVar10 + fVar10 * auVar113._8_4_;
                  auVar39._12_4_ = fVar11 + fVar11 * auVar113._12_4_;
                  auVar50._8_4_ = 0x219392ef;
                  auVar50._0_8_ = 0x219392ef219392ef;
                  auVar50._12_4_ = 0x219392ef;
                  auVar33 = vcmpps_avx(auVar33,auVar50,5);
                  auVar33 = vandps_avx(auVar33,auVar39);
                  auVar51._0_4_ = auVar134._0_4_ * auVar33._0_4_;
                  auVar51._4_4_ = auVar134._4_4_ * auVar33._4_4_;
                  auVar51._8_4_ = auVar134._8_4_ * auVar33._8_4_;
                  auVar51._12_4_ = auVar134._12_4_ * auVar33._12_4_;
                  local_838 = vminps_avx(auVar51,auVar63);
                  auVar40._0_4_ = auVar37._0_4_ * auVar33._0_4_;
                  auVar40._4_4_ = auVar37._4_4_ * auVar33._4_4_;
                  auVar40._8_4_ = auVar37._8_4_ * auVar33._8_4_;
                  auVar40._12_4_ = auVar37._12_4_ * auVar33._12_4_;
                  local_828 = vminps_avx(auVar40,auVar63);
                  uVar24 = vmovmskps_avx(auVar43);
                  uVar28 = CONCAT44((int)((ulong)stack >> 0x20),uVar24);
                  local_a70 = uVar25;
                  fStack_a4c = fStack_a50;
                  do {
                    uVar29 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    h.geomID = *(uint *)(lVar22 + uVar27 + 0x120 + uVar29 * 4);
                    pGVar7 = (local_a58->geometries).items[h.geomID].ptr;
                    if ((pGVar7->mask & ray->mask) == 0) {
                      uVar28 = uVar28 ^ 1L << (uVar29 & 0x3f);
                      bVar19 = true;
                    }
                    else {
                      pRVar8 = context->args;
                      if ((pRVar8->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar19 = false;
                        uVar25 = local_a70;
                      }
                      else {
                        local_ab8 = uVar21;
                        h.u = *(float *)(local_838 + uVar29 * 4);
                        h.v = *(float *)(local_828 + uVar29 * 4);
                        args.context = context->user;
                        h.primID = *(uint *)(lVar22 + uVar27 + 0x130 + uVar29 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + uVar29 * 4);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_7f8 + uVar29 * 4);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_7e8 + uVar29 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_ac8 = ray->tfar;
                        ray->tfar = *(float *)(local_818 + uVar29 * 4);
                        local_acc = -1;
                        args.valid = &local_acc;
                        args.geometryUserPtr = pGVar7->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002da66d:
                          if (pRVar8->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar8->filter)(&args);
                              auVar120 = ZEXT1664(local_a68);
                            }
                            if (*args.valid == 0) goto LAB_002da6c7;
                          }
                          bVar19 = false;
                        }
                        else {
                          local_a38._0_8_ = context;
                          local_a48._0_8_ = ray;
                          (*pGVar7->occlusionFilterN)(&args);
                          auVar120 = ZEXT1664(local_a68);
                          context = (RayQueryContext *)local_a38._0_8_;
                          ray = (Ray *)local_a48._0_8_;
                          if (*args.valid != 0) goto LAB_002da66d;
LAB_002da6c7:
                          ray->tfar = local_ac8;
                          uVar28 = uVar28 ^ 1L << (uVar29 & 0x3f);
                          bVar19 = true;
                        }
                        uVar21 = local_ab8;
                        uVar25 = local_a70;
                      }
                    }
                    iVar23 = 0;
                    if (!bVar19) {
                      uVar28 = local_a88;
                      uVar29 = local_a78;
                      uVar30 = local_a80;
                      if (bVar31) {
                        ray->tfar = -INFINITY;
                        iVar23 = 3;
                      }
                      goto LAB_002da734;
                    }
                  } while (uVar28 != 0);
                }
              }
              iVar23 = 0;
              uVar25 = uVar25 + 1;
              bVar31 = uVar25 < uVar21;
              uVar28 = local_a88;
              uVar29 = local_a78;
              uVar30 = local_a80;
            } while (uVar25 != uVar21);
          }
        }
LAB_002da734:
      } while (iVar23 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }